

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_DBL RVar3;
  REF_CELL pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__s;
  size_t sVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  REF_INT RVar11;
  REF_INT RVar12;
  int iVar13;
  REF_CELL *ppRVar14;
  bool bVar15;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nodes [27];
  long local_f8;
  long local_e0;
  REF_INT *local_d0;
  REF_INT *local_c8;
  long local_c0;
  REF_DBL local_b8;
  int local_b0;
  int local_ac;
  REF_INT local_a8 [4];
  REF_INT local_98;
  
  ref_node = ref_grid->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62d,
           "ref_export_bin_ugrid","unable to open file");
    return 2;
  }
  uVar5 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_node->n);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62f,
           "ref_export_bin_ugrid",(ulong)uVar5,"nnode");
    return 1;
  }
  RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[3]->n);
  if (RVar6 == 0) {
    RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[6]->n);
    if (RVar6 == 0) {
      RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[8]->n);
      if (RVar6 == 0) {
        RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[9]->n);
        if (RVar6 == 0) {
          RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[10]->n);
          if (RVar6 == 0) {
            RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,ref_grid->cell[0xb]->n);
            if (RVar6 == 0) {
              uVar5 = ref_node_compact(ref_node,&local_c8,&local_d0);
              if (uVar5 == 0) {
                if (0 < ref_node->n) {
                  local_f8 = 0;
                  do {
                    RVar3 = ref_node->real[(long)local_d0[local_f8] * 0xf];
                    local_b8 = (REF_DBL)((ulong)RVar3 >> 0x38 |
                                         ((ulong)RVar3 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar3 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar3 & 0xff00000000) >> 8 |
                                         ((ulong)RVar3 & 0xff000000) << 8 |
                                         ((ulong)RVar3 & 0xff0000) << 0x18 |
                                         ((ulong)RVar3 & 0xff00) << 0x28 | (long)RVar3 << 0x38);
                    if (swap == 0) {
                      local_b8 = RVar3;
                    }
                    sVar7 = fwrite(&local_b8,8,1,__s);
                    if (sVar7 != 1) {
                      pcVar10 = "x";
                      uVar8 = 0x648;
LAB_001157ac:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,uVar8,"ref_export_bin_ugrid",pcVar10,1,sVar7);
                      return 1;
                    }
                    RVar3 = ref_node->real[(long)local_d0[local_f8] * 0xf + 1];
                    local_b8 = (REF_DBL)((ulong)RVar3 >> 0x38 |
                                         ((ulong)RVar3 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar3 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar3 & 0xff00000000) >> 8 |
                                         ((ulong)RVar3 & 0xff000000) << 8 |
                                         ((ulong)RVar3 & 0xff0000) << 0x18 |
                                         ((ulong)RVar3 & 0xff00) << 0x28 | (long)RVar3 << 0x38);
                    if (swap == 0) {
                      local_b8 = RVar3;
                    }
                    sVar7 = fwrite(&local_b8,8,1,__s);
                    if (sVar7 != 1) {
                      pcVar10 = "y";
                      uVar8 = 0x64b;
                      goto LAB_001157ac;
                    }
                    RVar3 = ref_node->real[(long)local_d0[local_f8] * 0xf + 2];
                    local_b8 = (REF_DBL)((ulong)RVar3 >> 0x38 |
                                         ((ulong)RVar3 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar3 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar3 & 0xff00000000) >> 8 |
                                         ((ulong)RVar3 & 0xff000000) << 8 |
                                         ((ulong)RVar3 & 0xff0000) << 0x18 |
                                         ((ulong)RVar3 & 0xff00) << 0x28 | (long)RVar3 << 0x38);
                    if (swap == 0) {
                      local_b8 = RVar3;
                    }
                    sVar7 = fwrite(&local_b8,8,1,__s);
                    if (sVar7 != 1) {
                      pcVar10 = "z";
                      uVar8 = 0x64e;
                      goto LAB_001157ac;
                    }
                    local_f8 = local_f8 + 1;
                  } while (local_f8 < ref_node->n);
                }
                ref_export_faceid_range(ref_grid,&local_ac,&local_b0);
                if (local_ac <= local_b0) {
                  pRVar4 = ref_grid->cell[3];
                  uVar5 = pRVar4->node_per;
                  RVar11 = pRVar4->max;
                  local_c0 = (long)(int)uVar5;
                  iVar1 = local_ac;
                  do {
                    if (0 < RVar11) {
                      RVar12 = 0;
                      do {
                        RVar6 = ref_cell_nodes(pRVar4,RVar12,local_a8);
                        if ((RVar6 == 0) && (local_a8[local_c0] == iVar1 && 0 < (int)uVar5)) {
                          uVar9 = 0;
                          do {
                            iVar13 = local_c8[local_a8[uVar9]];
                            local_a8[uVar9] = iVar13 + 1;
                            RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar13 + 1);
                            if (RVar6 != 0) {
                              pcVar10 = "c2n";
                              uVar8 = 0x65a;
                              goto LAB_001151b6;
                            }
                            uVar9 = uVar9 + 1;
                          } while (uVar5 != uVar9);
                        }
                        RVar12 = RVar12 + 1;
                        RVar11 = pRVar4->max;
                      } while (RVar12 < RVar11);
                    }
                    bVar15 = iVar1 != local_b0;
                    iVar1 = iVar1 + 1;
                  } while (bVar15);
                  if (local_ac <= local_b0) {
                    pRVar4 = ref_grid->cell[6];
                    uVar5 = pRVar4->node_per;
                    RVar11 = pRVar4->max;
                    local_c0 = (long)(int)uVar5;
                    iVar1 = local_ac;
                    do {
                      if (0 < RVar11) {
                        iVar13 = 0;
                        do {
                          RVar6 = ref_cell_nodes(pRVar4,iVar13,local_a8);
                          if ((RVar6 == 0) && (local_a8[local_c0] == iVar1 && 0 < (int)uVar5)) {
                            uVar9 = 0;
                            do {
                              iVar2 = local_c8[local_a8[uVar9]];
                              local_a8[uVar9] = iVar2 + 1;
                              RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar2 + 1);
                              if (RVar6 != 0) {
                                pcVar10 = "c2n";
                                uVar8 = 0x667;
                                goto LAB_001151b6;
                              }
                              uVar9 = uVar9 + 1;
                            } while (uVar5 != uVar9);
                          }
                          iVar13 = iVar13 + 1;
                          RVar11 = pRVar4->max;
                        } while (iVar13 < RVar11);
                      }
                      bVar15 = iVar1 != local_b0;
                      iVar1 = iVar1 + 1;
                    } while (bVar15);
                    if (local_ac <= local_b0) {
                      pRVar4 = ref_grid->cell[3];
                      iVar1 = pRVar4->node_per;
                      RVar11 = pRVar4->max;
                      iVar13 = local_ac;
                      do {
                        if (0 < RVar11) {
                          RVar12 = 0;
                          do {
                            RVar6 = ref_cell_nodes(pRVar4,RVar12,local_a8);
                            if (((RVar6 == 0) && (local_a8[iVar1] == iVar13)) &&
                               (RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,local_a8[3]),
                               RVar6 != 0)) {
                              pcVar10 = "c2n";
                              uVar8 = 0x672;
                              goto LAB_001151b6;
                            }
                            RVar12 = RVar12 + 1;
                            RVar11 = pRVar4->max;
                          } while (RVar12 < RVar11);
                        }
                        bVar15 = iVar13 != local_b0;
                        iVar13 = iVar13 + 1;
                      } while (bVar15);
                      if (local_ac <= local_b0) {
                        pRVar4 = ref_grid->cell[6];
                        iVar1 = pRVar4->node_per;
                        RVar11 = pRVar4->max;
                        iVar13 = local_ac;
                        do {
                          if (0 < RVar11) {
                            RVar12 = 0;
                            do {
                              RVar6 = ref_cell_nodes(pRVar4,RVar12,local_a8);
                              if (((RVar6 == 0) && (local_a8[iVar1] == iVar13)) &&
                                 (RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,local_98),
                                 RVar6 != 0)) {
                                pcVar10 = "c2n";
                                uVar8 = 0x67c;
                                goto LAB_001151b6;
                              }
                              RVar12 = RVar12 + 1;
                              RVar11 = pRVar4->max;
                            } while (RVar12 < RVar11);
                          }
                          bVar15 = iVar13 != local_b0;
                          iVar13 = iVar13 + 1;
                        } while (bVar15);
                      }
                    }
                  }
                }
                ppRVar14 = ref_grid->cell + 8;
                local_e0 = 8;
                do {
                  pRVar4 = *ppRVar14;
                  if (0 < pRVar4->max) {
                    uVar5 = pRVar4->node_per;
                    RVar11 = 0;
                    do {
                      RVar6 = ref_cell_nodes(pRVar4,RVar11,local_a8);
                      if (RVar6 == 0 && 0 < (int)uVar5) {
                        uVar9 = 0;
                        do {
                          iVar1 = local_c8[local_a8[uVar9]];
                          local_a8[uVar9] = iVar1 + 1;
                          RVar6 = ref_export_bin_ugrid_int((FILE *)__s,swap,fat,iVar1 + 1);
                          if (RVar6 != 0) {
                            pcVar10 = "c2n";
                            uVar8 = 0x686;
                            goto LAB_001151b6;
                          }
                          uVar9 = uVar9 + 1;
                        } while (uVar5 != uVar9);
                      }
                      RVar11 = RVar11 + 1;
                    } while (RVar11 < pRVar4->max);
                  }
                  ppRVar14 = ref_grid->cell + local_e0 + 1;
                  local_e0 = local_e0 + 1;
                  if (local_e0 == 0x10) {
                    if (local_d0 != (REF_INT *)0x0) {
                      free(local_d0);
                    }
                    if (local_c8 != (REF_INT *)0x0) {
                      free(local_c8);
                    }
                    fclose(__s);
                    return 0;
                  }
                } while( true );
              }
              pcVar10 = "compact";
              uVar8 = 0x643;
              uVar9 = (ulong)uVar5;
              goto LAB_001151bc;
            }
            pcVar10 = "nhex";
            uVar8 = 0x641;
          }
          else {
            pcVar10 = "npri";
            uVar8 = 0x63e;
          }
        }
        else {
          pcVar10 = "npyr";
          uVar8 = 0x63b;
        }
      }
      else {
        pcVar10 = "ntet";
        uVar8 = 0x638;
      }
    }
    else {
      pcVar10 = "nqua";
      uVar8 = 0x635;
    }
  }
  else {
    pcVar10 = "ntri";
    uVar8 = 0x632;
  }
LAB_001151b6:
  uVar5 = 1;
  uVar9 = 1;
LAB_001151bc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar8,
         "ref_export_bin_ugrid",uVar9,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_DBL swapped_dbl;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_export_bin_ugrid_int(file, swap, fat, ref_node_n(ref_node)), "nnode");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tri(ref_grid))),
      "ntri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_qua(ref_grid))),
      "nqua");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tet(ref_grid))),
      "ntet");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pyr(ref_grid))),
      "npyr");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pri(ref_grid))),
      "npri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_hex(ref_grid))),
      "nhex");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    swapped_dbl = ref_node_xyz(ref_node, 0, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
    swapped_dbl = ref_node_xyz(ref_node, 1, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
    swapped_dbl = ref_node_xyz(ref_node, 2, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
  }

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[3]), "c2n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[4]), "c2n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++) {
        nodes[node] = o2n[nodes[node]] + 1;
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
      }
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}